

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc *psVar1;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  stbi_uc sVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  stbi_uc **ppsVar16;
  stbi_uc *psVar17;
  size_t sVar18;
  stbi_uc *psVar19;
  byte *pbVar20;
  uint uVar21;
  ulong uVar22;
  stbi_uc *psVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  stbi__uint32 raw_len_00;
  uint depth;
  size_t __size;
  long lVar27;
  long lVar28;
  int local_524;
  stbi_uc tc [3];
  ulong local_4c8;
  stbi__uint32 raw_len;
  ulong local_4b8;
  ulong local_4b0;
  stbi_uc *local_4a8;
  undefined8 local_4a0;
  stbi_uc *local_498;
  stbi_uc *local_490;
  size_t local_488;
  ulong local_480;
  stbi__context *local_478;
  int local_46c;
  ulong local_468;
  stbi_uc *local_460;
  long local_458;
  ulong local_450;
  long local_448;
  stbi_uc *local_440;
  stbi_uc palette [1024];
  
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar11 = stbi__check_png_header(s);
  if (iVar11 == 0) {
    local_524 = 0;
  }
  else {
    local_524 = 1;
    if (scan != 1) {
      ppsVar16 = &z->idata;
      local_498 = s->buffer_start;
      psVar1 = s->buffer_start + 1;
      local_468 = 0;
      bVar5 = true;
      local_4b0 = 0;
      depth = 0;
      bVar6 = false;
      local_4c8 = 0;
      __size = 0;
      local_4b8 = 0;
      local_4a0 = 0;
      bVar7 = 0;
      do {
        iVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        uVar15 = uVar12 + iVar11 * 0x10000;
        uVar13 = stbi__get16be(s);
        uVar14 = stbi__get16be(s);
        psVar17 = local_498;
        uVar24 = uVar13 << 0x10 | uVar14;
        uVar21 = (uint)local_4c8;
        if ((int)uVar24 < 0x49484452) {
          if (uVar24 == 0x43674249) {
            bVar6 = true;
LAB_00115829:
            stbi__skip(s,uVar15);
LAB_00115bba:
            stbi__get16be(s);
            stbi__get16be(s);
            bVar4 = true;
          }
          else {
            iVar11 = (int)local_4b8;
            if (uVar24 == 0x49444154) {
              if (bVar5) {
LAB_001158bf:
                stbi__g_failure_reason = "first not IHDR";
                bVar5 = true;
              }
              else {
                if ((bVar7 == 0) || (uVar21 != 0)) {
                  if (scan == 2) {
                    s->img_n = (uint)bVar7;
                    local_524 = 1;
                    bVar5 = false;
                    goto LAB_0011662a;
                  }
                  uVar12 = uVar15 + iVar11;
                  if (iVar11 <= (int)uVar12) {
                    if ((uint)__size < uVar12) {
                      sVar18 = 0x1000;
                      if (0x1000 < uVar15) {
                        sVar18 = (ulong)uVar15;
                      }
                      if ((uint)__size != 0) {
                        sVar18 = __size;
                      }
                      do {
                        __size = sVar18;
                        sVar18 = (ulong)((uint)__size * 2);
                      } while ((uint)__size < uVar12);
                      psVar17 = (stbi_uc *)realloc(*ppsVar16,__size);
                      if (psVar17 == (stbi_uc *)0x0) {
                        stbi__g_failure_reason = "outofmem";
                        goto LAB_001164e2;
                      }
                      *ppsVar16 = psVar17;
                    }
                    iVar11 = stbi__getn(s,*ppsVar16 + (local_4b8 & 0xffffffff),uVar15);
                    if (iVar11 != 0) {
                      bVar5 = false;
                      local_4b8 = (ulong)uVar12;
                      goto LAB_00115bba;
                    }
                    stbi__g_failure_reason = "outofdata";
                  }
LAB_001164e2:
                  bVar5 = false;
                  local_524 = 0;
                  bVar4 = false;
                  goto LAB_0011662c;
                }
                stbi__g_failure_reason = "no PLTE";
                local_4c8 = 0;
LAB_001159a7:
                bVar5 = false;
              }
              bVar4 = false;
              local_524 = 0;
            }
            else {
              if (uVar24 != 0x49454e44) {
LAB_00115861:
                if (bVar5) goto LAB_001158bf;
                bVar5 = false;
                if ((uVar13 >> 0xd & 1) == 0) {
                  stbi__parse_png_file::invalid_chunk[0] = (char)(uVar24 >> 0x18);
                  stbi__parse_png_file::invalid_chunk[1] = (char)(uVar24 >> 0x10);
                  stbi__parse_png_file::invalid_chunk[2] = (char)(uVar14 >> 8);
                  stbi__parse_png_file::invalid_chunk[3] = (char)uVar14;
                  stbi__g_failure_reason = stbi__parse_png_file::invalid_chunk;
                  goto LAB_001159a7;
                }
                goto LAB_00115829;
              }
              if (bVar5) {
                stbi__g_failure_reason = "first not IHDR";
LAB_0011575c:
                local_524 = 0;
              }
              else if (scan == 0) {
                if (*ppsVar16 == (stbi_uc *)0x0) {
                  stbi__g_failure_reason = "no IDAT";
                  goto LAB_0011575c;
                }
                raw_len = s->img_n * s->img_y * (s->img_x * depth + 7 >> 3) + s->img_y;
                psVar17 = (stbi_uc *)
                          stbi_zlib_decode_malloc_guesssize_headerflag
                                    ((char *)*ppsVar16,iVar11,raw_len,(int *)&raw_len,(uint)!bVar6);
                z->expanded = psVar17;
                local_524 = 0;
                if (psVar17 != (stbi_uc *)0x0) {
                  free(*ppsVar16);
                  raw_len_00 = raw_len;
                  *ppsVar16 = (stbi_uc *)0x0;
                  iVar11 = s->img_n + 1;
                  if ((char)local_4a0 == '\0' &&
                      ((bVar7 != 0 || req_comp == 3) || iVar11 != req_comp)) {
                    s->img_out_n = s->img_n;
                  }
                  else {
                    s->img_out_n = iVar11;
                  }
                  iVar11 = s->img_out_n;
                  x = z->s->img_x;
                  y = z->s->img_y;
                  if ((int)local_468 == 0) {
                    iVar11 = stbi__create_png_image_raw
                                       (z,z->expanded,raw_len,iVar11,x,y,depth,(int)local_4b0);
                    if (iVar11 == 0) goto LAB_0011662a;
                  }
                  else {
                    local_488 = (long)iVar11;
                    local_460 = z->expanded;
                    local_4a8 = (stbi_uc *)malloc((ulong)(x * iVar11 * y));
                    lVar28 = 0;
                    do {
                      psVar2 = z->s;
                      local_490 = (stbi_uc *)(long)(int)(&DAT_0011c6a0)[lVar28];
                      uVar15 = (&DAT_0011c6e0)[lVar28];
                      uVar24 = ~(&DAT_0011c6a0)[lVar28] + psVar2->img_x + uVar15;
                      uVar13 = uVar24 / uVar15;
                      uVar12 = (&DAT_0011c700)[lVar28];
                      uVar21 = ~(&DAT_0011c6c0)[lVar28] + psVar2->img_y + uVar12;
                      uVar14 = uVar21 / uVar12;
                      bVar3 = true;
                      if ((uVar15 <= uVar24) && (uVar12 <= uVar21)) {
                        local_478 = (stbi__context *)
                                    CONCAT44(local_478._4_4_,(&DAT_0011c6c0)[lVar28]);
                        local_46c = uVar13 * depth * psVar2->img_n;
                        local_458 = lVar28;
                        iVar11 = stbi__create_png_image_raw
                                           (z,local_460,raw_len_00,(int)local_488,uVar13,uVar14,
                                            depth,(int)local_4b0);
                        if (iVar11 == 0) {
                          free(local_4a8);
                          bVar3 = false;
                          lVar28 = local_458;
                        }
                        else {
                          if (0 < (int)uVar14) {
                            local_450 = (ulong)uVar14;
                            iVar11 = (int)local_488;
                            iVar25 = (int)local_478 * iVar11;
                            local_490 = local_4a8 + (long)local_490 * local_488;
                            lVar28 = (long)(int)uVar15 * local_488;
                            local_480 = 0;
                            do {
                              sVar18 = local_488;
                              if (0 < (int)uVar13) {
                                local_478 = z->s;
                                local_440 = z->out;
                                local_448 = local_480 * (long)(int)uVar13;
                                lVar27 = 0;
                                psVar17 = local_490;
                                do {
                                  memcpy(psVar17 + local_478->img_x * iVar25,
                                         local_440 + (local_448 + lVar27) * sVar18,sVar18);
                                  lVar27 = lVar27 + 1;
                                  psVar17 = psVar17 + lVar28;
                                } while (lVar27 < (int)uVar13);
                              }
                              local_480 = local_480 + 1;
                              iVar25 = iVar25 + uVar12 * iVar11;
                            } while (local_480 < local_450);
                          }
                          uVar14 = ((local_46c + 7 >> 3) + 1) * uVar14;
                          free(z->out);
                          local_460 = local_460 + uVar14;
                          raw_len_00 = raw_len_00 - uVar14;
                          bVar3 = true;
                          lVar28 = local_458;
                        }
                      }
                      if (!bVar3) goto LAB_0011662a;
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 7);
                    z->out = local_4a8;
                  }
                  if ((char)local_4a0 != '\0') {
                    psVar17 = z->out;
                    iVar11 = z->s->img_y * z->s->img_x;
                    if (s->img_out_n == 2) {
                      if (iVar11 != 0) {
                        lVar28 = 0;
                        do {
                          psVar17[lVar28 * 2 + 1] = -(psVar17[lVar28 * 2] != tc[0]);
                          lVar28 = lVar28 + 1;
                        } while (iVar11 != (int)lVar28);
                      }
                    }
                    else if (iVar11 != 0) {
                      lVar28 = 0;
                      do {
                        if (((psVar17[lVar28 * 4] == tc[0]) && (psVar17[lVar28 * 4 + 1] == tc[1]))
                           && (psVar17[lVar28 * 4 + 2] == tc[2])) {
                          psVar17[lVar28 * 4 + 3] = '\0';
                        }
                        lVar28 = lVar28 + 1;
                      } while (iVar11 != (int)lVar28);
                    }
                  }
                  if (((bVar6) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
                    stbi__de_iphone(z);
                  }
                  if (bVar7 != 0) {
                    s->img_n = (uint)bVar7;
                    uVar15 = (uint)bVar7;
                    if (2 < req_comp) {
                      uVar15 = req_comp;
                    }
                    s->img_out_n = uVar15;
                    psVar17 = z->out;
                    uVar12 = z->s->img_y * z->s->img_x;
                    psVar19 = (stbi_uc *)malloc((ulong)(uVar12 * uVar15));
                    if (psVar19 == (stbi_uc *)0x0) {
                      stbi__g_failure_reason = "outofmem";
                    }
                    else {
                      if (uVar15 == 3) {
                        if (uVar12 != 0) {
                          uVar22 = 0;
                          psVar23 = psVar19;
                          do {
                            uVar26 = (ulong)psVar17[uVar22];
                            *psVar23 = palette[uVar26 * 4];
                            psVar23[1] = palette[uVar26 * 4 + 1];
                            psVar23[2] = palette[uVar26 * 4 + 2];
                            psVar23 = psVar23 + 3;
                            uVar22 = uVar22 + 1;
                          } while (uVar12 != uVar22);
                        }
                      }
                      else if (uVar12 != 0) {
                        uVar22 = 0;
                        do {
                          *(undefined4 *)(psVar19 + uVar22 * 4) =
                               *(undefined4 *)(palette + (ulong)psVar17[uVar22] * 4);
                          uVar22 = uVar22 + 1;
                        } while (uVar12 != uVar22);
                      }
                      free(psVar17);
                      z->out = psVar19;
                    }
                    if (psVar19 == (stbi_uc *)0x0) goto LAB_0011662a;
                  }
                  free(z->expanded);
                  z->expanded = (stbi_uc *)0x0;
                  goto LAB_00115957;
                }
              }
              else {
LAB_00115957:
                local_524 = 1;
              }
LAB_0011662a:
              bVar4 = false;
            }
          }
        }
        else {
          if (uVar24 == 0x74524e53) {
            if (bVar5) {
              stbi__g_failure_reason = "first not IHDR";
              bVar5 = true;
            }
            else {
              if (*ppsVar16 == (stbi_uc *)0x0) {
                if (bVar7 == 0) {
                  if ((s->img_n & 1U) == 0) {
                    stbi__g_failure_reason = "tRNS with alpha";
                  }
                  else {
                    uVar12 = s->img_n * 2;
                    if (uVar12 == uVar15) {
                      local_4a0 = CONCAT71((uint7)(uint3)(uVar12 >> 8),1);
                      if (0 < s->img_n) {
                        lVar28 = 0;
                        do {
                          iVar11 = stbi__get16be(s);
                          tc[lVar28] = ""[depth] * (char)iVar11;
                          lVar28 = lVar28 + 1;
                        } while (lVar28 < s->img_n);
                      }
                      bVar7 = 0;
LAB_00116643:
                      bVar5 = false;
                      goto LAB_00115bba;
                    }
                    stbi__g_failure_reason = "bad tRNS len";
                  }
                  bVar5 = false;
                  bVar7 = 0;
                  goto LAB_00115be9;
                }
                if (scan != 2) {
                  if (uVar21 == 0) {
                    stbi__g_failure_reason = "tRNS before PLTE";
                    local_4c8 = 0;
                  }
                  else {
                    if (uVar15 <= uVar21) {
                      bVar7 = 4;
                      if (uVar15 != 0) {
                        uVar22 = 0;
                        do {
                          psVar19 = s->img_buffer;
                          if (psVar19 < s->img_buffer_end) {
LAB_00116290:
                            s->img_buffer = psVar19 + 1;
                            sVar9 = *psVar19;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar25 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                              if (iVar25 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar17;
                                s->img_buffer_end = psVar1;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar17;
                                s->img_buffer_end = psVar17 + iVar25;
                              }
                              psVar19 = s->img_buffer;
                              goto LAB_00116290;
                            }
                            sVar9 = '\0';
                          }
                          palette[uVar22 * 4 + 3] = sVar9;
                          uVar22 = uVar22 + 1;
                        } while (uVar12 + iVar11 * 0x10000 != uVar22);
                      }
                      goto LAB_00116643;
                    }
                    stbi__g_failure_reason = "bad tRNS len";
                  }
                  goto LAB_00115933;
                }
                s->img_n = 4;
                local_524 = 1;
                bVar5 = false;
                goto LAB_00115bf1;
              }
              stbi__g_failure_reason = "tRNS after IDAT";
LAB_00115933:
              bVar5 = false;
            }
            local_524 = 0;
          }
          else {
            if (uVar24 != 0x504c5445) {
              if (uVar24 != 0x49484452) goto LAB_00115861;
              if (bVar5) {
                if (uVar15 != 0xd) {
                  stbi__g_failure_reason = "bad IHDR len";
                  goto LAB_00115b9d;
                }
                iVar11 = stbi__get16be(s);
                uVar15 = stbi__get16be(s);
                psVar17 = local_498;
                uVar15 = uVar15 | iVar11 << 0x10;
                s->img_x = uVar15;
                if (0x1000000 < uVar15) {
LAB_00115806:
                  stbi__g_failure_reason = "too large";
                  goto LAB_00115b9d;
                }
                iVar11 = stbi__get16be(s);
                uVar15 = stbi__get16be(s);
                uVar15 = uVar15 | iVar11 << 0x10;
                s->img_y = uVar15;
                if (0x1000000 < uVar15) goto LAB_00115806;
                pbVar20 = s->img_buffer;
                if (pbVar20 < s->img_buffer_end) {
LAB_001163f5:
                  s->img_buffer = pbVar20 + 1;
                  bVar8 = *pbVar20;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                    if (iVar11 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar17;
                      s->img_buffer_end = psVar1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar17;
                      s->img_buffer_end = psVar17 + iVar11;
                    }
                    pbVar20 = s->img_buffer;
                    goto LAB_001163f5;
                  }
                  bVar8 = 0;
                }
                depth = (uint)bVar8;
                if ((8 < bVar8) || ((0x116U >> (bVar8 & 0x1f) & 1) == 0)) {
                  stbi__g_failure_reason = "1/2/4/8-bit only";
                  goto LAB_00115b9d;
                }
                pbVar20 = s->img_buffer;
                if (pbVar20 < s->img_buffer_end) {
LAB_0011651d:
                  s->img_buffer = pbVar20 + 1;
                  bVar8 = *pbVar20;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                    if (iVar11 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar17;
                      s->img_buffer_end = psVar1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar17;
                      s->img_buffer_end = psVar17 + iVar11;
                    }
                    pbVar20 = s->img_buffer;
                    goto LAB_0011651d;
                  }
                  bVar8 = 0;
                }
                local_4b0 = (ulong)bVar8;
                if ((bVar8 < 7) && ((bVar10 = 3, bVar8 == 3 || (bVar10 = bVar7, (bVar8 & 1) == 0))))
                {
                  bVar7 = bVar10;
                  psVar19 = s->img_buffer;
                  if (psVar19 < s->img_buffer_end) {
LAB_00116674:
                    s->img_buffer = psVar19 + 1;
                    if (*psVar19 == '\0') goto LAB_00116690;
                    stbi__g_failure_reason = "bad comp method";
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                      if (iVar11 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar17 + iVar11;
                      }
                      psVar19 = s->img_buffer;
                      goto LAB_00116674;
                    }
LAB_00116690:
                    sVar9 = stbi__get8(s);
                    if (sVar9 == '\0') {
                      bVar10 = stbi__get8(s);
                      local_468 = (ulong)bVar10;
                      if (bVar10 < 2) {
                        uVar15 = s->img_x;
                        if ((uVar15 != 0) && (uVar12 = s->img_y, uVar12 != 0)) {
                          if (bVar7 == 0) {
                            uVar13 = (3 < bVar8) + 1 + ((uint)local_4b0 & 2);
                            s->img_n = uVar13;
                            if (uVar12 <= (uint)((0x40000000 / (ulong)uVar15) / (ulong)uVar13)) {
                              if (scan == 2) {
                                local_524 = 1;
                                bVar3 = false;
                                bVar7 = 0;
                                goto LAB_00115ba5;
                              }
                              goto LAB_001167a2;
                            }
                            stbi__g_failure_reason = "too large";
                            bVar7 = 0;
                          }
                          else {
                            s->img_n = 1;
                            if (uVar12 <= (uint)(0x40000000 / (ulong)uVar15 >> 2)) {
LAB_001167a2:
                              bVar3 = true;
                              goto LAB_00115ba5;
                            }
                            stbi__g_failure_reason = "too large";
                          }
                          goto LAB_00115b9d;
                        }
                        stbi__g_failure_reason = "0-pixel image";
                      }
                      else {
                        stbi__g_failure_reason = "bad interlace method";
                      }
                    }
                    else {
                      stbi__g_failure_reason = "bad filter method";
                    }
                  }
                  bVar3 = false;
                  local_524 = 0;
                }
                else {
                  stbi__g_failure_reason = "bad ctype";
                  bVar3 = false;
                  local_524 = 0;
                }
              }
              else {
                stbi__g_failure_reason = "multiple IHDR";
LAB_00115b9d:
                bVar3 = false;
                local_524 = 0;
              }
LAB_00115ba5:
              bVar5 = false;
              bVar4 = false;
              if (bVar3) goto LAB_00115bba;
              goto LAB_0011662c;
            }
            if (bVar5) {
              stbi__g_failure_reason = "first not IHDR";
              bVar5 = true;
            }
            else {
              if ((uVar15 < 0x301) &&
                 (local_4c8 = (ulong)uVar12 * 0x55555556 >> 0x20,
                 (int)((ulong)uVar12 * 0x55555556 >> 0x20) * 3 == uVar15)) {
                bVar5 = false;
                if (uVar12 < 3) goto LAB_00116643;
                uVar22 = 0;
                do {
                  psVar19 = s->img_buffer;
                  if (psVar19 < s->img_buffer_end) {
LAB_00115a6d:
                    s->img_buffer = psVar19 + 1;
                    sVar9 = *psVar19;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                      if (iVar11 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar17 + iVar11;
                      }
                      psVar19 = s->img_buffer;
                      goto LAB_00115a6d;
                    }
                    sVar9 = '\0';
                  }
                  palette[uVar22 * 4] = sVar9;
                  psVar19 = s->img_buffer;
                  if (psVar19 < s->img_buffer_end) {
LAB_00115ae7:
                    s->img_buffer = psVar19 + 1;
                    sVar9 = *psVar19;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                      if (iVar11 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar17 + iVar11;
                      }
                      psVar19 = s->img_buffer;
                      goto LAB_00115ae7;
                    }
                    sVar9 = '\0';
                  }
                  palette[uVar22 * 4 + 1] = sVar9;
                  psVar19 = s->img_buffer;
                  if (psVar19 < s->img_buffer_end) {
LAB_00115b61:
                    s->img_buffer = psVar19 + 1;
                    sVar9 = *psVar19;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                      if (iVar11 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar17 + iVar11;
                      }
                      psVar19 = s->img_buffer;
                      goto LAB_00115b61;
                    }
                    sVar9 = '\0';
                  }
                  palette[uVar22 * 4 + 2] = sVar9;
                  palette[uVar22 * 4 + 3] = 0xff;
                  uVar22 = uVar22 + 1;
                } while (local_4c8 != uVar22);
                goto LAB_00115bba;
              }
              stbi__g_failure_reason = "invalid PLTE";
              bVar5 = false;
            }
LAB_00115be9:
            local_524 = 0;
          }
LAB_00115bf1:
          bVar4 = false;
        }
LAB_0011662c:
      } while (bVar4);
    }
  }
  return local_524;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, depth=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            depth = stbi__get8(s);  if (depth != 1 && depth != 2 && depth != 4 && depth != 8)  return stbi__err("1/2/4/8-bit only","PNG not supported: 1/2/4/8-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               for (k=0; k < s->img_n; ++k)
                  tc[k] = (stbi_uc) (stbi__get16be(s) & 255) * stbi__depth_scale_table[depth]; // non 8-bit images will be larger
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               p = (stbi_uc *) STBI_REALLOC(z->idata, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, depth, color, interlace)) return 0;
            if (has_trans)
               if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}